

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

bool checkcodesection(void)

{
  bool bVar1;
  
  if (currentSection == (Section *)0x0) {
    bVar1 = false;
    error("Cannot output data outside of a SECTION\n");
  }
  else {
    if (currentSection->type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    bVar1 = true;
    if ((currentSection->type & ~SECTTYPE_VRAM) != SECTTYPE_ROMX) {
      bVar1 = false;
      error("Section \'%s\' cannot contain code or data (not ROM0 or ROMX)\n",currentSection->name);
    }
  }
  return bVar1;
}

Assistant:

static bool checksection(void)
{
	if (currentSection)
		return true;

	error("Cannot output data outside of a SECTION\n");
	return false;
}